

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum4096_32.c
# Opt level: O1

void bn_slow_precomp(uint32_t len,uint64_t *n,uint64_t mu,uint64_t *r2,uint64_t *a,uint64_t *res)

{
  long lVar1;
  uint64_t *puVar2;
  uint64_t *r2_00;
  uint64_t nInv;
  uint64_t *res_00;
  size_t __n;
  uint64_t *c;
  uint64_t auStack_60 [2];
  uint64_t *local_50;
  uint64_t *local_48;
  uint64_t local_40;
  uint64_t *local_38;
  
  lVar1 = -((ulong)len * 8 + 0xf & 0xfffffffffffffff0);
  res_00 = (uint64_t *)((long)auStack_60 + lVar1 + 8);
  local_50 = res;
  local_48 = r2;
  local_40 = mu;
  local_38 = a;
  *(undefined8 *)((long)auStack_60 + lVar1) = 0x19abc9;
  memset(res_00,0,(ulong)len << 3);
  __n = (ulong)(len * 2) * 8;
  c = res_00 + -(ulong)(len * 2);
  c[-1] = 0x19abeb;
  memset(c,0,__n);
  puVar2 = local_38;
  c[-1] = 0x19abfa;
  memcpy(c,puVar2,__n);
  nInv = local_40;
  c[-1] = 0x19ac12;
  Hacl_Bignum_AlmostMontgomery_bn_almost_mont_reduction_u64(len,n,nInv,c,res_00);
  r2_00 = local_48;
  puVar2 = local_50;
  c[-1] = 0x19ac2b;
  Hacl_Bignum_Montgomery_bn_to_mont_u64(len,n,nInv,r2_00,res_00,puVar2);
  return;
}

Assistant:

static inline void
bn_slow_precomp(uint32_t *n, uint32_t mu, uint32_t *r2, uint32_t *a, uint32_t *res)
{
  uint32_t a_mod[128U] = { 0U };
  uint32_t a1[256U] = { 0U };
  memcpy(a1, a, 256U * sizeof (uint32_t));
  areduction(n, mu, a1, a_mod);
  to(n, mu, r2, a_mod, res);
}